

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O3

int Ssw_ManSweepLatch(Ssw_Man_t *p)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  int iVar3;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void **ppvVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  Ssw_Sat_t *pSVar9;
  ulong uVar10;
  Aig_Obj_t *pAVar11;
  uint uVar12;
  int iVar13;
  void **ppvVar14;
  int iVar15;
  Aig_Obj_t **ppAVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pAVar4 = Aig_ManStart(p->pAig->vObjs->nSize);
  p->pFrames = pAVar4;
  uVar10 = (ulong)p->nFrames;
  p->pNodeToFrames[(long)p->pAig->pConst1->Id * uVar10] = pAVar4->pConst1;
  pAVar4 = p->pAig;
  if (0 < pAVar4->nTruePis) {
    lVar17 = 0;
    do {
      if (pAVar4->vCis->nSize <= lVar17) goto LAB_006aaca9;
      pvVar1 = pAVar4->vCis->pArray[lVar17];
      pAVar5 = Aig_ObjCreateCi(p->pFrames);
      uVar10 = (ulong)p->nFrames;
      p->pNodeToFrames[(long)*(int *)((long)pvVar1 + 0x24) * uVar10] = pAVar5;
      lVar17 = lVar17 + 1;
      pAVar4 = p->pAig;
    } while (lVar17 < pAVar4->nTruePis);
  }
  if (0 < pAVar4->nRegs) {
    iVar15 = 0;
    do {
      uVar12 = pAVar4->nTruePis + iVar15;
      if (((int)uVar12 < 0) || (pAVar4->vCis->nSize <= (int)uVar12)) goto LAB_006aaca9;
      pvVar1 = pAVar4->vCis->pArray[uVar12];
      if (pAVar4->pReprs == (Aig_Obj_t **)0x0) {
LAB_006aa9ba:
        pAVar5 = Aig_ObjCreateCi(p->pFrames);
        (pAVar5->field_5).pData = pvVar1;
        uVar10 = (ulong)(uint)p->nFrames;
        ppAVar16 = p->pNodeToFrames;
        iVar13 = *(int *)((long)pvVar1 + 0x24);
      }
      else {
        iVar13 = *(int *)((long)pvVar1 + 0x24);
        pAVar5 = pAVar4->pReprs[iVar13];
        if (pAVar5 == (Aig_Obj_t *)0x0) goto LAB_006aa9ba;
        ppAVar16 = p->pNodeToFrames;
        pAVar5 = (Aig_Obj_t *)
                 ((ulong)((*(uint *)((long)pvVar1 + 0x18) ^ *(uint *)&pAVar5->field_0x18) >> 3 & 1)
                 ^ (ulong)ppAVar16[(long)(int)uVar10 * (long)pAVar5->Id]);
      }
      ppAVar16[iVar13 * (int)uVar10] = pAVar5;
      iVar15 = iVar15 + 1;
      pAVar4 = p->pAig;
    } while (iVar15 < pAVar4->nRegs);
  }
  Aig_ManSetCioIds(p->pFrames);
  if (p->vSimInfo != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vSimInfo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswLcorr.c"
                  ,0x10c,"int Ssw_ManSweepLatch(Ssw_Man_t *)");
  }
  iVar15 = p->pFrames->nObjs[2];
  lVar17 = (long)iVar15;
  ppvVar6 = (void **)malloc(lVar17 * 0xc);
  auVar2 = _DAT_0093d220;
  if (0 < lVar17) {
    ppvVar7 = ppvVar6 + lVar17;
    uVar10 = (ulong)(iVar15 + 1U & 0xfffffffe);
    lVar17 = lVar17 + -1;
    auVar18._8_4_ = (int)lVar17;
    auVar18._0_8_ = lVar17;
    auVar18._12_4_ = (int)((ulong)lVar17 >> 0x20);
    ppvVar14 = ppvVar6 + 1;
    auVar18 = auVar18 ^ _DAT_0093d220;
    auVar19 = _DAT_0093d210;
    do {
      auVar20 = auVar19 ^ auVar2;
      if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                  auVar18._4_4_ < auVar20._4_4_) & 1)) {
        ppvVar14[-1] = ppvVar7;
      }
      if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
          auVar20._12_4_ <= auVar18._12_4_) {
        *ppvVar14 = (void *)((long)ppvVar7 + 4);
      }
      lVar17 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar17 + 2;
      ppvVar14 = ppvVar14 + 2;
      ppvVar7 = ppvVar7 + 1;
      uVar10 = uVar10 - 2;
    } while (uVar10 != 0);
  }
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nSize = iVar15;
  pVVar8->nCap = iVar15;
  pVVar8->pArray = ppvVar6;
  p->vSimInfo = pVVar8;
  if (0 < iVar15) {
    lVar17 = 0;
    do {
      *(undefined4 *)pVVar8->pArray[lVar17] = 0;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar8->nSize);
  }
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar8->pArray = ppvVar6;
  iVar15 = 0;
  p->fRefined = 0;
  p->nCallsSat = 0;
  p->nCallsUnsat = 0;
  p->nCallsCount = 0;
  pAVar4 = p->pAig;
  if (0 < pAVar4->nRegs) {
    do {
      uVar12 = pAVar4->nTruePis + iVar15;
      if (((int)uVar12 < 0) || (pAVar4->vCis->nSize <= (int)uVar12)) {
LAB_006aaca9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar5 = (Aig_Obj_t *)pAVar4->vCis->pArray[uVar12];
      if (pAVar4->pReprs == (Aig_Obj_t **)0x0) {
        pAVar11 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar11 = pAVar4->pReprs[pAVar5->Id];
      }
      if (pAVar11 == pAVar4->pConst1) {
        Ssw_ManSweepLatchOne(p,pAVar4->pConst1,pAVar5);
LAB_006aabfe:
        if (p->nPatterns == 0x20) {
LAB_006aac04:
          Ssw_ManSweepResimulate(p);
        }
        iVar13 = p->pPars->nSatVarMax;
        if (iVar13 != 0) {
          pSVar9 = p->pMSat;
          iVar3 = pSVar9->nSatVars;
          if ((iVar13 < iVar3) && (p->pPars->nRecycleCalls < p->nRecycleCalls)) {
            if (iVar3 < p->nVarsMax) {
              iVar3 = p->nVarsMax;
            }
            p->nVarsMax = iVar3;
            iVar13 = pSVar9->nSolverCalls;
            if (pSVar9->nSolverCalls < p->nCallsMax) {
              iVar13 = p->nCallsMax;
            }
            p->nCallsMax = iVar13;
            Ssw_SatStop(pSVar9);
            pSVar9 = Ssw_SatStart(0);
            p->pMSat = pSVar9;
            p->nRecycles = p->nRecycles + 1;
            p->nRecycleCalls = 0;
          }
        }
      }
      else {
        Ssw_ClassesCollectClass(p->ppClasses,pAVar5,pVVar8);
        iVar13 = pVVar8->nSize;
        if (iVar13 != 0) {
          if (0 < iVar13) {
            lVar17 = 0;
            do {
              ppAVar16 = p->pAig->pReprs;
              if (ppAVar16 == (Aig_Obj_t **)0x0) {
                pAVar11 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar11 = ppAVar16[((Aig_Obj_t *)pVVar8->pArray[lVar17])->Id];
              }
              if (pAVar11 == pAVar5) {
                Ssw_ManSweepLatchOne(p,pAVar5,(Aig_Obj_t *)pVVar8->pArray[lVar17]);
                if (p->nPatterns == 0x20) goto LAB_006aac04;
                iVar13 = pVVar8->nSize;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < iVar13);
          }
          goto LAB_006aabfe;
        }
      }
      iVar15 = iVar15 + 1;
      pAVar4 = p->pAig;
    } while (iVar15 < pAVar4->nRegs);
  }
  if (0 < p->nPatterns) {
    Ssw_ManSweepResimulate(p);
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepLatch( Ssw_Man_t * p )
{
//    Bar_Progress_t * pProgress = NULL;
    Vec_Ptr_t * vClass;
    Aig_Obj_t * pObj, * pRepr, * pTemp;
    int i, k;

    // start the timeframe
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) );
    // map constants and PIs
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), 0, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(p->pFrames) );

    // implement equivalence classes
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr( p->pAig, pObj );
        if ( pRepr == NULL )
        {
            pTemp = Aig_ObjCreateCi(p->pFrames);
            pTemp->pData = pObj;
        }
        else
            pTemp = Aig_NotCond( Ssw_ObjFrame(p, pRepr, 0), pRepr->fPhase ^ pObj->fPhase );
        Ssw_ObjSetFrame( p, pObj, 0, pTemp );
    }
    Aig_ManSetCioIds( p->pFrames );

    // prepare simulation info
    assert( p->vSimInfo == NULL );
    p->vSimInfo = Vec_PtrAllocSimInfo( Aig_ManCiNum(p->pFrames), 1 );
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );

    // go through the registers
//    if ( p->pPars->fVerbose )
//        pProgress = Bar_ProgressStart( stdout, Aig_ManRegNum(p->pAig) );
    vClass = Vec_PtrAlloc( 100 );
    p->fRefined = 0;
    p->nCallsCount = p->nCallsSat = p->nCallsUnsat = 0;
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
//        if ( p->pPars->fVerbose )
//            Bar_ProgressUpdate( pProgress, i, NULL );
        // consider the case of constant candidate
        if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
            Ssw_ManSweepLatchOne( p, Aig_ManConst1(p->pAig), pObj );
        else
        {
            // consider the case of equivalence class
            Ssw_ClassesCollectClass( p->ppClasses, pObj, vClass );
            if ( Vec_PtrSize(vClass) == 0 )
                continue;
            // try to prove equivalences in this class
            Vec_PtrForEachEntry( Aig_Obj_t *, vClass, pTemp, k )
                if ( Aig_ObjRepr(p->pAig, pTemp) == pObj )
                {
                    Ssw_ManSweepLatchOne( p, pObj, pTemp );
                    if ( p->nPatterns == 32 )
                        break;
                }
        }
        // resimulate
        if ( p->nPatterns == 32 )
            Ssw_ManSweepResimulate( p );
        // attempt recycling the SAT solver
        if ( p->pPars->nSatVarMax &&
             p->pMSat->nSatVars > p->pPars->nSatVarMax &&
             p->nRecycleCalls > p->pPars->nRecycleCalls )
        {
            p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
            p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
            Ssw_SatStop( p->pMSat );
            p->pMSat = Ssw_SatStart( 0 );
            p->nRecycles++;
            p->nRecycleCalls = 0;
        }
    }
//    ABC_PRT( "reduce", p->timeReduce );
//    Aig_TableProfile( p->pFrames );
//    Abc_Print( 1, "And gates = %d\n", Aig_ManNodeNum(p->pFrames) );
    // resimulate
    if ( p->nPatterns > 0 )
        Ssw_ManSweepResimulate( p );
    // cleanup
    Vec_PtrFree( vClass );
//    if ( p->pPars->fVerbose )
//        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}